

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

void tlsio_openssl_destroy(CONCRETE_IO_HANDLE tls_io)

{
  LOGGER_LOG p_Var1;
  TLS_IO_INSTANCE *tls_io_instance;
  LOGGER_LOG l;
  CONCRETE_IO_HANDLE tls_io_local;
  
  if (tls_io == (CONCRETE_IO_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_destroy",0x561,1,"NULL tls_io.");
    }
  }
  else {
    engine_destroy((TLS_IO_INSTANCE *)tls_io);
    if (*(long *)((long)tls_io + 0x70) != 0) {
      free(*(void **)((long)tls_io + 0x70));
      *(undefined8 *)((long)tls_io + 0x70) = 0;
    }
    if (*(long *)((long)tls_io + 0x78) != 0) {
      free(*(void **)((long)tls_io + 0x78));
      *(undefined8 *)((long)tls_io + 0x78) = 0;
    }
    free(*(void **)((long)tls_io + 0x80));
    *(undefined8 *)((long)tls_io + 0x80) = 0;
    free(*(void **)((long)tls_io + 0x88));
    *(undefined8 *)((long)tls_io + 0x88) = 0;
    close_openssl_instance((TLS_IO_INSTANCE *)tls_io);
    if (*tls_io != 0) {
      xio_destroy(*tls_io);
      *(undefined8 *)tls_io = 0;
    }
    free(*(void **)((long)tls_io + 0xa8));
    *(undefined8 *)((long)tls_io + 0xa8) = 0;
    if (*(long *)((long)tls_io + 0xb0) != 0) {
      free(*(void **)((long)tls_io + 0xb0));
      *(undefined8 *)((long)tls_io + 0xb0) = 0;
    }
    free(tls_io);
  }
  return;
}

Assistant:

void tlsio_openssl_destroy(CONCRETE_IO_HANDLE tls_io)
{
    if (tls_io == NULL)
    {
        LogError("NULL tls_io.");
    }
    else
    {
        TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)tls_io;
        engine_destroy(tls_io_instance);

        if (tls_io_instance->certificate != NULL)
        {
            free(tls_io_instance->certificate);
            tls_io_instance->certificate = NULL;
        }
        if (tls_io_instance->cipher_list != NULL)
        {
            free(tls_io_instance->cipher_list);
            tls_io_instance->cipher_list = NULL;
        }
        free((void*)tls_io_instance->x509_certificate);
        tls_io_instance->x509_certificate = NULL;
        free((void*)tls_io_instance->x509_private_key);
        tls_io_instance->x509_private_key = NULL;
        close_openssl_instance(tls_io_instance);
        if (tls_io_instance->underlying_io != NULL)
        {
            xio_destroy(tls_io_instance->underlying_io);
            tls_io_instance->underlying_io = NULL;
        }
        free(tls_io_instance->hostname);
        tls_io_instance->hostname = NULL;
        if (tls_io_instance->engine_id != NULL)
        {
            free(tls_io_instance->engine_id);
            tls_io_instance->engine_id = NULL;
        }

        free(tls_io);
    }
}